

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O0

int fy_atom_cmp(fy_atom *atom1,fy_atom *atom2)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int local_434;
  size_t local_430;
  int ret;
  int c2;
  int c1;
  size_t l;
  size_t l2;
  size_t l1;
  char *d2;
  char *d1;
  fy_atom_iter iter2;
  fy_atom_iter iter1;
  fy_atom *atom2_local;
  fy_atom *atom1_local;
  
  if (atom1 == atom2) {
    atom1_local._4_4_ = 1;
  }
  else if ((atom1 == (fy_atom *)0x0) || (atom2 == (fy_atom *)0x0)) {
    atom1_local._4_4_ = 0;
  }
  else {
    if ((*(uint *)&atom1->field_0x34 >> 10 & 1) == 0) {
      d2 = (char *)0x0;
      l2 = 0;
    }
    else {
      d2 = fy_atom_data(atom1);
      l2 = fy_atom_size(atom1);
    }
    if ((*(uint *)&atom2->field_0x34 >> 10 & 1) == 0) {
      l1 = 0;
      l = 0;
    }
    else {
      l1 = (size_t)fy_atom_data(atom2);
      l = fy_atom_size(atom2);
    }
    if ((d2 == (char *)0x0) || (l1 == 0)) {
      if (l1 == 0) {
        if (d2 == (char *)0x0) {
          fy_atom_iter_start(atom1,(fy_atom_iter *)&iter2.unget_c);
          fy_atom_iter_start(atom2,(fy_atom_iter *)&d1);
          do {
            iVar1 = fy_atom_iter_getc((fy_atom_iter *)&iter2.unget_c);
            iVar2 = fy_atom_iter_getc((fy_atom_iter *)&d1);
            bVar3 = false;
            if ((iVar1 == iVar2) && (bVar3 = false, -1 < iVar1)) {
              bVar3 = -1 < iVar2;
            }
          } while (bVar3);
          fy_atom_iter_finish((fy_atom_iter *)&d1);
          fy_atom_iter_finish((fy_atom_iter *)&iter2.unget_c);
          if ((iVar1 == -1) && (iVar2 == -1)) {
            atom1_local._4_4_ = 0;
          }
          else {
            atom1_local._4_4_ = 1;
            if (iVar1 < iVar2) {
              atom1_local._4_4_ = -1;
            }
          }
        }
        else {
          iVar1 = fy_atom_memcmp(atom2,d2,l2);
          atom1_local._4_4_ = -iVar1;
        }
      }
      else {
        atom1_local._4_4_ = fy_atom_memcmp(atom1,(void *)l1,l);
      }
    }
    else {
      if (l < l2) {
        local_430 = l;
      }
      else {
        local_430 = l2;
      }
      atom1_local._4_4_ = memcmp(d2,(void *)l1,local_430);
      if (atom1_local._4_4_ == 0) {
        if (l2 == l) {
          local_434 = 0;
        }
        else {
          local_434 = 1;
          if (l2 < l) {
            local_434 = -1;
          }
        }
        atom1_local._4_4_ = local_434;
      }
    }
  }
  return atom1_local._4_4_;
}

Assistant:

int fy_atom_cmp(struct fy_atom *atom1, struct fy_atom *atom2) {
    struct fy_atom_iter iter1, iter2;
    const char *d1, *d2;
    size_t l1, l2, l;
    int c1, c2, ret;

    /* handles NULL case too */
    if (atom1 == atom2)
        return true;

    /* either null, can't do */
    if (!atom1 || !atom2)
        return false;

    /* direct output? */
    if (atom1->direct_output) {
        d1 = fy_atom_data(atom1);
        l1 = fy_atom_size(atom1);
    } else {
        d1 = NULL;
        l1 = 0;
    }
    if (atom2->direct_output) {
        d2 = fy_atom_data(atom2);
        l2 = fy_atom_size(atom2);
    } else {
        d2 = NULL;
        l2 = 0;
    }

    /* we have both atoms with direct output */
    if (d1 && d2) {
        l = l1 > l2 ? l2 : l1;
        ret = memcmp(d1, d2, l);
        if (ret)
            return ret;
        return l1 == l2 ? 0 : l2 > l1 ? -1 : 1;
    }

    /* only atom2 is direct */
    if (d2)
        return fy_atom_memcmp(atom1, d2, l2);

    /* only atom1 is direct, (note reversing sign) */
    if (d1)
        return -fy_atom_memcmp(atom2, d1, l1);

    /* neither is direct, do it with iterators */
    fy_atom_iter_start(atom1, &iter1);
    fy_atom_iter_start(atom2, &iter2);
    do {
        c1 = fy_atom_iter_getc(&iter1);
        c2 = fy_atom_iter_getc(&iter2);
    } while (c1 == c2 && c1 >= 0 && c2 >= 0);
    fy_atom_iter_finish(&iter2);
    fy_atom_iter_finish(&iter1);

    if (c1 == -1 && c2 == -1)
        return 0;

    return c2 > c1 ? -1 : 1;
}